

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

void __thiscall
QGraphicsScenePrivate::registerScenePosItem(QGraphicsScenePrivate *this,QGraphicsItem *item)

{
  long in_FS_OFFSET;
  QSet<QGraphicsItem_*> local_30 [2];
  QGraphicsItem *item_local;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  item_local = item;
  QSet<QGraphicsItem_*>::insert(local_30,(QGraphicsItem **)&this->scenePosItems);
  setScenePosItemEnabled(this,item_local,true);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::registerScenePosItem(QGraphicsItem *item)
{
    scenePosItems.insert(item);
    setScenePosItemEnabled(item, true);
}